

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# write_test.cc
# Opt level: O3

void intgemm::kernel_write_test<(intgemm::CPUType)3,signed_char>(void)

{
  undefined1 auVar1 [32];
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  char *pcVar13;
  char cVar14;
  long lVar15;
  ulong uVar16;
  undefined1 auVar17 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 in_ZMM10 [64];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 in_ZMM12 [64];
  undefined1 auVar31 [32];
  AlignedVector<signed_char> input;
  AlignedVector<signed_char> output;
  AssertionHandler catchAssertionHandler;
  char local_e9;
  AlignedVector<signed_char> local_e8;
  AlignedVector<signed_char> local_d8;
  SourceLineInfo local_c8;
  ITransientExpression local_b8;
  char *local_a8;
  char *local_a0;
  size_t sStack_98;
  char *local_90;
  StringRef local_88;
  AssertionHandler local_78;
  undefined1 auVar18 [32];
  
  auVar30 = in_ZMM12._0_32_;
  auVar28 = in_ZMM10._0_16_;
  if (2 < kCPU) {
    AlignedVector<signed_char>::AlignedVector(&local_e8,0x20,0x40);
    AlignedVector<signed_char>::AlignedVector(&local_d8,0x20,0x40);
    if (local_e8.size_ != 0) {
      lVar15 = local_e8.size_ - 1;
      auVar17._8_8_ = lVar15;
      auVar17._0_8_ = lVar15;
      auVar18._16_8_ = lVar15;
      auVar18._0_16_ = auVar17;
      auVar18._24_8_ = lVar15;
      uVar16 = 0;
      auVar1 = vpmovsxbq_avx2(ZEXT416(0x17161514));
      auVar2 = vpmovsxbq_avx2(ZEXT416(0x13121110));
      auVar3 = vpmovsxbq_avx2(ZEXT416(0xf0e0d0c));
      auVar4 = vpmovsxbq_avx2(ZEXT416(0xb0a0908));
      auVar5 = vpmovsxbq_avx2(ZEXT416(0x7060504));
      auVar6 = vpmovsxbq_avx2(ZEXT416(0x3020100));
      auVar27._8_8_ = 0x8000000000000000;
      auVar27._0_8_ = 0x8000000000000000;
      auVar28 = vpcmpeqd_avx(auVar28,auVar28);
      auVar29._8_8_ = 0x8000000000000000;
      auVar29._0_8_ = 0x8000000000000000;
      auVar29._16_8_ = 0x8000000000000000;
      auVar29._24_8_ = 0x8000000000000000;
      auVar30 = vpcmpeqd_avx2(auVar30,auVar30);
      do {
        auVar31._8_8_ = uVar16;
        auVar31._0_8_ = uVar16;
        auVar31._16_8_ = uVar16;
        auVar31._24_8_ = uVar16;
        auVar7 = vpor_avx2(auVar31,auVar6);
        auVar19 = vpcmpgtq_avx(auVar7._0_16_ ^ auVar27,auVar27 ^ auVar17);
        auVar19 = vpackssdw_avx(auVar19,auVar19);
        auVar19 = vpackssdw_avx(auVar28 ^ auVar19,auVar28 ^ auVar19);
        auVar19 = vpacksswb_avx(auVar19,auVar19);
        cVar14 = (char)uVar16;
        if ((auVar19 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          local_e8.mem_[uVar16] = cVar14;
        }
        auVar19 = vpcmpgtq_avx(auVar7._0_16_ ^ auVar27,auVar27 ^ auVar17);
        auVar19 = vpackssdw_avx(auVar19,auVar19);
        auVar19 = vpackssdw_avx(auVar28 ^ auVar19,auVar28 ^ auVar19);
        auVar19 = vpacksswb_avx(auVar19,auVar19);
        if ((auVar19 >> 8 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          local_e8.mem_[uVar16 + 1] = cVar14 + '\x01';
        }
        auVar9 = auVar29 ^ auVar18;
        auVar7 = vpcmpgtq_avx2(auVar7 ^ auVar29,auVar9);
        auVar8 = vpshuflw_avx2(auVar7,0xe8);
        auVar19._0_4_ = auVar8._16_4_;
        auVar19._4_4_ = auVar19._0_4_;
        auVar19._8_4_ = auVar19._0_4_;
        auVar19._12_4_ = auVar19._0_4_;
        auVar19 = vpackssdw_avx(auVar28 ^ auVar19,auVar28 ^ auVar19);
        auVar19 = vpacksswb_avx(auVar19,auVar19);
        if ((auVar19 >> 0x10 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          local_e8.mem_[uVar16 + 2] = cVar14 + '\x02';
        }
        auVar19 = vpackssdw_avx(auVar7._16_16_,auVar7._16_16_);
        auVar19 = vpackssdw_avx(auVar28 ^ auVar19,auVar28 ^ auVar19);
        auVar19 = vpacksswb_avx(auVar19,auVar19);
        if ((auVar19 >> 0x18 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          local_e8.mem_[uVar16 + 3] = cVar14 + '\x03';
        }
        auVar8 = vpor_avx2(auVar31,auVar5);
        auVar19 = vpcmpgtq_avx(auVar8._0_16_ ^ auVar27,auVar27 ^ auVar17);
        auVar19 = vpackssdw_avx(auVar19,auVar19);
        auVar7 = vpermq_avx2(ZEXT1632(auVar28 ^ auVar19),0x55);
        auVar7 = vpackssdw_avx2(auVar7,auVar18);
        auVar20._0_2_ = auVar7._16_2_;
        auVar20._2_2_ = auVar20._0_2_;
        auVar20._4_2_ = auVar20._0_2_;
        auVar20._6_2_ = auVar20._0_2_;
        auVar20._8_2_ = auVar20._0_2_;
        auVar20._10_2_ = auVar20._0_2_;
        auVar20._12_2_ = auVar20._0_2_;
        auVar20._14_2_ = auVar20._0_2_;
        auVar19 = vpacksswb_avx(auVar20,auVar20);
        if ((auVar19 >> 0x20 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          local_e8.mem_[uVar16 + 4] = cVar14 + '\x04';
        }
        auVar19 = vpcmpgtq_avx(auVar8._0_16_ ^ auVar27,auVar27 ^ auVar17);
        auVar19 = vpshufhw_avx(auVar19,0x84);
        auVar7 = vpermq_avx2(ZEXT1632(auVar28 ^ auVar19),0x55);
        auVar7 = vpackssdw_avx2(auVar7,auVar18);
        auVar21._0_4_ = auVar7._16_4_;
        auVar21._4_4_ = auVar21._0_4_;
        auVar21._8_4_ = auVar21._0_4_;
        auVar21._12_4_ = auVar21._0_4_;
        auVar19 = vpacksswb_avx(auVar21,auVar21);
        if ((auVar19 >> 0x28 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          local_e8.mem_[uVar16 + 5] = cVar14 + '\x05';
        }
        auVar8 = vpcmpgtq_avx2(auVar8 ^ auVar29,auVar9);
        auVar7 = vpackssdw_avx2(auVar18,auVar8);
        auVar19 = auVar28 ^ auVar7._16_16_;
        auVar19 = vpackssdw_avx(auVar19,auVar19);
        auVar19 = vpacksswb_avx(auVar19,auVar19);
        if ((auVar19 >> 0x30 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          local_e8.mem_[uVar16 + 6] = cVar14 + '\x06';
        }
        auVar7 = vpshufhw_avx2(auVar8,0x84);
        auVar19 = auVar28 ^ auVar7._16_16_;
        auVar19 = vpackssdw_avx(auVar19,auVar19);
        auVar19 = vpacksswb_avx(auVar19,auVar19);
        if ((auVar19 >> 0x38 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          local_e8.mem_[uVar16 + 7] = cVar14 + '\a';
        }
        auVar8 = vpor_avx2(auVar31,auVar4);
        auVar19 = vpcmpgtq_avx(auVar8._0_16_ ^ auVar27,auVar27 ^ auVar17);
        auVar19 = vpackssdw_avx(auVar19,auVar19);
        auVar19 = vpackssdw_avx(auVar28 ^ auVar19,auVar28 ^ auVar19);
        auVar7 = vpmovzxwd_avx2(auVar19);
        auVar7 = vpacksswb_avx2(auVar7,auVar18);
        if ((auVar7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) {
          local_e8.mem_[uVar16 + 8] = cVar14 + '\b';
        }
        auVar19 = vpcmpgtq_avx(auVar8._0_16_ ^ auVar27,auVar27 ^ auVar17);
        auVar19 = vpackssdw_avx(auVar19,auVar19);
        auVar19 = vpackssdw_avx(auVar28 ^ auVar19,auVar28 ^ auVar19);
        auVar7 = vpermq_avx2(ZEXT1632(auVar19),0x55);
        auVar7 = vpacksswb_avx2(auVar7,auVar18);
        if ((auVar7._16_16_ >> 8 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          local_e8.mem_[uVar16 + 9] = cVar14 + '\t';
        }
        auVar8 = vpcmpgtq_avx2(auVar8 ^ auVar29,auVar9);
        auVar7 = vpshuflw_avx2(auVar8,0xe8);
        auVar22._0_4_ = auVar7._16_4_;
        auVar22._4_4_ = auVar22._0_4_;
        auVar22._8_4_ = auVar22._0_4_;
        auVar22._12_4_ = auVar22._0_4_;
        auVar19 = vpackssdw_avx(auVar28 ^ auVar22,auVar28 ^ auVar22);
        auVar7 = vpermq_avx2(ZEXT1632(auVar19),0x55);
        auVar7 = vpacksswb_avx2(auVar7,auVar18);
        if ((auVar7._16_16_ >> 0x10 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          local_e8.mem_[uVar16 + 10] = cVar14 + '\n';
        }
        auVar19 = vpackssdw_avx(auVar8._16_16_,auVar8._16_16_);
        auVar19 = vpackssdw_avx(auVar28 ^ auVar19,auVar28 ^ auVar19);
        auVar7 = vpermq_avx2(ZEXT1632(auVar19),0x55);
        auVar7 = vpacksswb_avx2(auVar7,auVar18);
        if ((auVar7._16_16_ >> 0x18 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          local_e8.mem_[uVar16 + 0xb] = cVar14 + '\v';
        }
        auVar8 = vpor_avx2(auVar31,auVar3);
        auVar19 = vpcmpgtq_avx(auVar8._0_16_ ^ auVar27,auVar27 ^ auVar17);
        auVar19 = vpackssdw_avx(auVar19,auVar19);
        auVar7 = vpermq_avx2(ZEXT1632(auVar28 ^ auVar19),0x55);
        auVar7 = vpackssdw_avx2(auVar18,auVar7);
        auVar7 = vpacksswb_avx2(auVar7,auVar18);
        if ((auVar7._16_16_ >> 0x20 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          local_e8.mem_[uVar16 + 0xc] = cVar14 + '\f';
        }
        auVar19 = vpcmpgtq_avx(auVar8._0_16_ ^ auVar27,auVar27 ^ auVar17);
        auVar19 = vpshufhw_avx(auVar19,0x84);
        auVar7 = vpermq_avx2(ZEXT1632(auVar28 ^ auVar19),0x55);
        auVar7 = vpackssdw_avx2(auVar18,auVar7);
        auVar7 = vpacksswb_avx2(auVar7,auVar18);
        if ((auVar7._16_16_ >> 0x28 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          local_e8.mem_[uVar16 + 0xd] = cVar14 + '\r';
        }
        auVar8 = vpcmpgtq_avx2(auVar8 ^ auVar29,auVar9);
        auVar7 = vpackssdw_avx2(auVar18,auVar8);
        auVar7 = vpackssdw_avx2(auVar18,auVar30 ^ auVar7);
        auVar7 = vpacksswb_avx2(auVar7,auVar18);
        if ((auVar7._16_16_ >> 0x30 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          local_e8.mem_[uVar16 + 0xe] = cVar14 + '\x0e';
        }
        auVar7 = vpshufhw_avx2(auVar8,0x84);
        auVar7 = vpackssdw_avx2(auVar18,auVar30 ^ auVar7);
        auVar7 = vpacksswb_avx2(auVar7,auVar18);
        if ((auVar7._16_16_ >> 0x38 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          local_e8.mem_[uVar16 + 0xf] = cVar14 + '\x0f';
        }
        auVar7 = vpor_avx2(auVar31,auVar2);
        auVar19 = vpcmpgtq_avx(auVar7._0_16_ ^ auVar27,auVar27 ^ auVar17);
        auVar19 = vpackssdw_avx(auVar19,auVar19);
        auVar19 = vpackssdw_avx(auVar28 ^ auVar19,auVar28 ^ auVar19);
        auVar19 = vpacksswb_avx(auVar19,auVar19);
        if ((auVar19 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          local_e8.mem_[uVar16 + 0x10] = cVar14 + '\x10';
        }
        auVar19 = vpcmpgtq_avx(auVar7._0_16_ ^ auVar27,auVar27 ^ auVar17);
        auVar19 = vpackssdw_avx(auVar19,auVar19);
        auVar19 = vpackssdw_avx(auVar28 ^ auVar19,auVar28 ^ auVar19);
        auVar19 = vpacksswb_avx(auVar19,auVar19);
        if ((auVar19 >> 8 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          local_e8.mem_[uVar16 + 0x11] = cVar14 + '\x11';
        }
        auVar7 = vpcmpgtq_avx2(auVar7 ^ auVar29,auVar9);
        auVar8 = vpshuflw_avx2(auVar7,0xe8);
        auVar23._0_4_ = auVar8._16_4_;
        auVar23._4_4_ = auVar23._0_4_;
        auVar23._8_4_ = auVar23._0_4_;
        auVar23._12_4_ = auVar23._0_4_;
        auVar19 = vpackssdw_avx(auVar28 ^ auVar23,auVar28 ^ auVar23);
        auVar19 = vpacksswb_avx(auVar19,auVar19);
        if ((auVar19 >> 0x10 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          local_e8.mem_[uVar16 + 0x12] = cVar14 + '\x12';
        }
        auVar19 = vpackssdw_avx(auVar7._16_16_,auVar7._16_16_);
        auVar19 = vpackssdw_avx(auVar28 ^ auVar19,auVar28 ^ auVar19);
        auVar19 = vpacksswb_avx(auVar19,auVar19);
        if ((auVar19 >> 0x18 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          local_e8.mem_[uVar16 + 0x13] = cVar14 + '\x13';
        }
        auVar8 = vpor_avx2(auVar31,auVar1);
        auVar19 = vpcmpgtq_avx(auVar8._0_16_ ^ auVar27,auVar27 ^ auVar17);
        auVar19 = vpackssdw_avx(auVar19,auVar19);
        auVar7 = vpermq_avx2(ZEXT1632(auVar28 ^ auVar19),0x55);
        auVar7 = vpackssdw_avx2(auVar7,auVar18);
        auVar24._0_2_ = auVar7._16_2_;
        auVar24._2_2_ = auVar24._0_2_;
        auVar24._4_2_ = auVar24._0_2_;
        auVar24._6_2_ = auVar24._0_2_;
        auVar24._8_2_ = auVar24._0_2_;
        auVar24._10_2_ = auVar24._0_2_;
        auVar24._12_2_ = auVar24._0_2_;
        auVar24._14_2_ = auVar24._0_2_;
        auVar19 = vpacksswb_avx(auVar24,auVar24);
        if ((auVar19 >> 0x20 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          local_e8.mem_[uVar16 + 0x14] = cVar14 + '\x14';
        }
        auVar19 = vpcmpgtq_avx(auVar8._0_16_ ^ auVar27,auVar27 ^ auVar17);
        auVar19 = vpshufhw_avx(auVar19,0x84);
        auVar7 = vpermq_avx2(ZEXT1632(auVar28 ^ auVar19),0x55);
        auVar7 = vpackssdw_avx2(auVar7,auVar18);
        auVar25._0_4_ = auVar7._16_4_;
        auVar25._4_4_ = auVar25._0_4_;
        auVar25._8_4_ = auVar25._0_4_;
        auVar25._12_4_ = auVar25._0_4_;
        auVar19 = vpacksswb_avx(auVar25,auVar25);
        if ((auVar19 >> 0x28 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          local_e8.mem_[uVar16 + 0x15] = cVar14 + '\x15';
        }
        auVar8 = vpcmpgtq_avx2(auVar8 ^ auVar29,auVar9);
        auVar7 = vpackssdw_avx2(auVar18,auVar8);
        auVar19 = auVar28 ^ auVar7._16_16_;
        auVar19 = vpackssdw_avx(auVar19,auVar19);
        auVar19 = vpacksswb_avx(auVar19,auVar19);
        if ((auVar19 >> 0x30 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          local_e8.mem_[uVar16 + 0x16] = cVar14 + '\x16';
        }
        auVar7 = vpshufhw_avx2(auVar8,0x84);
        auVar19 = auVar28 ^ auVar7._16_16_;
        auVar19 = vpackssdw_avx(auVar19,auVar19);
        auVar19 = vpacksswb_avx(auVar19,auVar19);
        if ((auVar19 >> 0x38 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          local_e8.mem_[uVar16 + 0x17] = cVar14 + '\x17';
        }
        auVar8 = vpor_avx2(auVar31,_DAT_001b7f80);
        auVar19 = vpcmpgtq_avx(auVar8._0_16_ ^ auVar27,auVar27 ^ auVar17);
        auVar19 = vpackssdw_avx(auVar19,auVar19);
        auVar19 = vpackssdw_avx(auVar28 ^ auVar19,auVar28 ^ auVar19);
        auVar7 = vpmovzxwd_avx2(auVar19);
        auVar7 = vpacksswb_avx2(auVar18,auVar7);
        if ((auVar7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) {
          local_e8.mem_[uVar16 + 0x18] = cVar14 + '\x18';
        }
        auVar19 = vpcmpgtq_avx(auVar8._0_16_ ^ auVar27,auVar27 ^ auVar17);
        auVar19 = vpackssdw_avx(auVar19,auVar19);
        auVar19 = vpackssdw_avx(auVar28 ^ auVar19,auVar28 ^ auVar19);
        auVar7 = vpermq_avx2(ZEXT1632(auVar19),0x55);
        auVar7 = vpacksswb_avx2(auVar18,auVar7);
        if ((auVar7._16_16_ >> 8 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          local_e8.mem_[uVar16 + 0x19] = cVar14 + '\x19';
        }
        auVar8 = vpcmpgtq_avx2(auVar8 ^ auVar29,auVar9);
        auVar7 = vpshuflw_avx2(auVar8,0xe8);
        auVar26._0_4_ = auVar7._16_4_;
        auVar26._4_4_ = auVar26._0_4_;
        auVar26._8_4_ = auVar26._0_4_;
        auVar26._12_4_ = auVar26._0_4_;
        auVar19 = vpackssdw_avx(auVar28 ^ auVar26,auVar28 ^ auVar26);
        auVar7 = vpermq_avx2(ZEXT1632(auVar19),0x55);
        auVar7 = vpacksswb_avx2(auVar18,auVar7);
        if ((auVar7._16_16_ >> 0x10 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          local_e8.mem_[uVar16 + 0x1a] = cVar14 + '\x1a';
        }
        auVar19 = vpackssdw_avx(auVar8._16_16_,auVar8._16_16_);
        auVar19 = vpackssdw_avx(auVar28 ^ auVar19,auVar28 ^ auVar19);
        auVar7 = vpermq_avx2(ZEXT1632(auVar19),0x55);
        auVar7 = vpacksswb_avx2(auVar18,auVar7);
        if ((auVar7._16_16_ >> 0x18 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          local_e8.mem_[uVar16 + 0x1b] = cVar14 + '\x1b';
        }
        auVar31 = vpor_avx2(auVar31,_DAT_001b7f60);
        auVar19 = vpcmpgtq_avx(auVar31._0_16_ ^ auVar27,auVar27 ^ auVar17);
        auVar19 = vpackssdw_avx(auVar19,auVar19);
        auVar7 = vpermq_avx2(ZEXT1632(auVar28 ^ auVar19),0x55);
        auVar7 = vpackssdw_avx2(auVar18,auVar7);
        auVar7 = vpacksswb_avx2(auVar18,auVar7);
        if ((auVar7._16_16_ >> 0x20 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          local_e8.mem_[uVar16 + 0x1c] = cVar14 + '\x1c';
        }
        auVar19 = vpcmpgtq_avx(auVar31._0_16_ ^ auVar27,auVar27 ^ auVar17);
        auVar19 = vpshufhw_avx(auVar19,0x84);
        auVar7 = vpermq_avx2(ZEXT1632(auVar28 ^ auVar19),0x55);
        auVar7 = vpackssdw_avx2(auVar18,auVar7);
        auVar7 = vpacksswb_avx2(auVar18,auVar7);
        if ((auVar7._16_16_ >> 0x28 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          local_e8.mem_[uVar16 + 0x1d] = cVar14 + '\x1d';
        }
        auVar31 = vpcmpgtq_avx2(auVar31 ^ auVar29,auVar9);
        auVar7 = vpackssdw_avx2(auVar18,auVar31);
        auVar7 = vpackssdw_avx2(auVar18,auVar30 ^ auVar7);
        auVar7 = vpacksswb_avx2(auVar18,auVar7);
        if ((auVar7._16_16_ >> 0x30 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          local_e8.mem_[uVar16 + 0x1e] = cVar14 + '\x1e';
        }
        auVar7 = vpshufhw_avx2(auVar31,0x84);
        auVar7 = vpackssdw_avx2(auVar18,auVar30 ^ auVar7);
        auVar7 = vpacksswb_avx2(auVar18,auVar7);
        if ((auVar7._16_16_ >> 0x38 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          local_e8.mem_[uVar16 + 0x1f] = cVar14 + '\x1f';
        }
        uVar16 = uVar16 + 0x20;
      } while ((local_e8.size_ + 0x1f & 0xffffffffffffffe0) != uVar16);
    }
    uVar10 = *(undefined8 *)(local_e8.mem_ + 8);
    uVar11 = *(undefined8 *)(local_e8.mem_ + 0x10);
    uVar12 = *(undefined8 *)(local_e8.mem_ + 0x18);
    *(undefined8 *)local_d8.mem_ = *(undefined8 *)local_e8.mem_;
    *(undefined8 *)(local_d8.mem_ + 8) = uVar10;
    *(undefined8 *)(local_d8.mem_ + 0x10) = uVar11;
    *(undefined8 *)(local_d8.mem_ + 0x18) = uVar12;
    lVar15 = 0;
    do {
      local_b8._vptr_ITransientExpression = (_func_int **)0x1b2b11;
      local_b8.m_isBinaryExpression = true;
      local_b8.m_result = false;
      local_b8._10_6_ = 0;
      local_c8.file =
           "/workspace/llm4binary/github/license_c_cmakelists/kpu[P]intgemm/test/kernels/write_test.cc"
      ;
      local_c8.line = 0x1c;
      Catch::StringRef::StringRef(&local_88,"output[i] == ElemType_(i)");
      Catch::AssertionHandler::AssertionHandler
                (&local_78,(StringRef *)&local_b8,&local_c8,local_88,ContinueOnFailure);
      pcVar13 = local_d8.mem_;
      cVar14 = local_d8.mem_[lVar15];
      local_e9 = (char)lVar15;
      Catch::StringRef::StringRef((StringRef *)&local_c8,"==");
      local_b8.m_result = (char)lVar15 == cVar14;
      local_b8.m_isBinaryExpression = true;
      local_a8 = pcVar13 + lVar15;
      local_b8._vptr_ITransientExpression =
           (_func_int **)&PTR_streamReconstructedExpression_001eb9d8;
      local_a0 = local_c8.file;
      sStack_98 = local_c8.line;
      local_90 = &local_e9;
      Catch::AssertionHandler::handleExpr(&local_78,&local_b8);
      Catch::ITransientExpression::~ITransientExpression(&local_b8);
      Catch::AssertionHandler::complete(&local_78);
      if (local_78.m_completed == false) {
        (*(local_78.m_resultCapture)->_vptr_IResultCapture[0xe])(local_78.m_resultCapture,&local_78)
        ;
      }
      lVar15 = lVar15 + 1;
    } while (lVar15 != 0x20);
    free(local_d8.mem_);
    free(local_e8.mem_);
  }
  return;
}

Assistant:

void kernel_write_test() {
  if (kCPU < CPUType_)
    return;

  using vec_t = vector_t<CPUType_, ElemType_>;
  constexpr static std::size_t VECTOR_LENGTH = sizeof(vec_t) / sizeof(ElemType_);

  AlignedVector<ElemType_> input(VECTOR_LENGTH);
  AlignedVector<ElemType_> output(VECTOR_LENGTH);

  std::iota(input.begin(), input.end(), static_cast<ElemType_>(0));

  kernels::write(*input.template as<vec_t>(), output.begin(), 0);
  for (std::size_t i = 0; i < VECTOR_LENGTH; ++i)
#if !defined( __EXCEPTIONS) && defined(__GNUC__) && (__GNUC__ == 9) && ((__GNUC_MINOR__ == 3) || (__GNUC_MINOR__ == 4))
    CHECK(output[i] == input[i]); // GCC 9.3 - exceptions breaks std::iota with newer check.
#else
    CHECK(output[i] == ElemType_(i));
#endif
}